

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPat.c
# Opt level: O2

void Gia_SatVerifyPattern(Gia_Man_t *p,Gia_Obj_t *pRoot,Vec_Int_t *vCex,Vec_Int_t *vVisit)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  uint v;
  char *__assertion;
  uint uVar7;
  
  if (((int)(uint)*(undefined8 *)pRoot < 0) &&
     (uVar2 = (uint)*(undefined8 *)pRoot & 0x1fffffff, uVar2 != 0x1fffffff)) {
    if ((~*(ulong *)(pRoot + -(ulong)uVar2) & 0x1fffffff1fffffff) != 0) {
      Gia_SatCollectCone(p,pRoot + -(ulong)uVar2,vVisit);
      for (iVar6 = 0; iVar6 < vCex->nSize; iVar6 = iVar6 + 1) {
        uVar2 = Vec_IntEntry(vCex,iVar6);
        if ((int)uVar2 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                        ,0x10c,"int Abc_Lit2Var(int)");
        }
        iVar3 = Vec_IntEntry(p->vCis,uVar2 >> 1);
        pGVar4 = Gia_ManObj(p,iVar3);
        Sat_ObjSetXValue(pGVar4,2 - (uVar2 & 1));
      }
      for (iVar6 = 0; iVar6 < vVisit->nSize; iVar6 = iVar6 + 1) {
        iVar3 = Vec_IntEntry(vVisit,iVar6);
        pGVar4 = Gia_ManObj(p,iVar3);
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        uVar1 = *(ulong *)pGVar4;
        uVar2 = (uint)uVar1;
        if ((~uVar2 & 0x9fffffff) != 0) {
          if (((int)uVar2 < 0) || ((uVar2 & 0x1fffffff) == 0x1fffffff)) {
            __assertion = "Gia_ObjIsAnd(pObj)";
            uVar2 = 0x6e;
            goto LAB_005b4e88;
          }
          uVar5 = (uint)(*(ulong *)(pGVar4 + -(ulong)(uVar2 & 0x1fffffff)) >> 0x1e) & 1 |
                  (uint)(*(ulong *)(pGVar4 + -(ulong)(uVar2 & 0x1fffffff)) >> 0x3d) & 2;
          uVar7 = (uint)(*(ulong *)(pGVar4 + -(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)) >> 0x1e)
                  & 1 | (uint)(*(ulong *)(pGVar4 + -(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)) >>
                              0x3d) & 2;
          v = 1;
          if (((uVar1 >> 0x3d & 1) != 0) + 1 != uVar7) {
            v = (uVar5 == 3 || uVar7 == 3) | 2;
          }
          if (((uVar2 >> 0x1d & 1) != 0) + 1 == uVar5) {
            v = 1;
          }
          Sat_ObjSetXValue(pGVar4,v);
        }
      }
      uVar2 = (uint)(*(ulong *)(pRoot + -(ulong)((uint)*(undefined8 *)pRoot & 0x1fffffff)) >> 0x1e)
              & 1 | (uint)(*(ulong *)(pRoot + -(ulong)((uint)*(undefined8 *)pRoot & 0x1fffffff)) >>
                          0x3d) & 2;
      if ((uVar2 == 3) || ((((uint)*(undefined8 *)pRoot >> 0x1d & 1) != 0) + 1 == uVar2)) {
        puts("Gia_SatVerifyPattern(): Verification FAILED.");
      }
      iVar6 = 0;
      while( true ) {
        if (vVisit->nSize <= iVar6) {
          return;
        }
        iVar3 = Vec_IntEntry(vVisit,iVar6);
        pGVar4 = Gia_ManObj(p,iVar3);
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        *(ulong *)pGVar4 = *(ulong *)pGVar4 & 0xbfffffffbfffffff;
        iVar6 = iVar6 + 1;
      }
      return;
    }
    __assertion = "!Gia_ObjIsConst0(Gia_ObjFanin0(pRoot))";
    uVar2 = 0x62;
  }
  else {
    __assertion = "Gia_ObjIsCo(pRoot)";
    uVar2 = 0x61;
  }
LAB_005b4e88:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                ,uVar2,
                "void Gia_SatVerifyPattern(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

void Gia_SatVerifyPattern( Gia_Man_t * p, Gia_Obj_t * pRoot, Vec_Int_t * vCex, Vec_Int_t * vVisit )
{
    Gia_Obj_t * pObj;
    int i, Entry, Value, Value0, Value1;
    assert( Gia_ObjIsCo(pRoot) );
    assert( !Gia_ObjIsConst0(Gia_ObjFanin0(pRoot)) );
    // collect nodes and initialized them to x
    Gia_SatCollectCone( p, Gia_ObjFanin0(pRoot), vVisit );
    // set binary values to nodes in the counter-example
    Vec_IntForEachEntry( vCex, Entry, i )
//        Sat_ObjSetXValue( Gia_ManObj(p, Abc_Lit2Var(Entry)), Abc_LitIsCompl(Entry)? GIA_ZER : GIA_ONE );
        Sat_ObjSetXValue( Gia_ManCi(p, Abc_Lit2Var(Entry)), Abc_LitIsCompl(Entry)? GIA_ZER : GIA_ONE );
    // simulate
    Gia_ManForEachObjVec( vVisit, p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            continue;
        assert( Gia_ObjIsAnd(pObj) );
        Value0 = Sat_ObjXValue( Gia_ObjFanin0(pObj) );
        Value1 = Sat_ObjXValue( Gia_ObjFanin1(pObj) );
        Value = Gia_XsimAndCond( Value0, Gia_ObjFaninC0(pObj), Value1, Gia_ObjFaninC1(pObj) );
        Sat_ObjSetXValue( pObj, Value );
    }
    Value = Sat_ObjXValue( Gia_ObjFanin0(pRoot) );
    Value = Gia_XsimNotCond( Value, Gia_ObjFaninC0(pRoot) );
    if ( Value != GIA_ONE )
        printf( "Gia_SatVerifyPattern(): Verification FAILED.\n" );
//    else
//        printf( "Gia_SatVerifyPattern(): Verification succeeded.\n" );
//    assert( Value == GIA_ONE );
    // clean the nodes
    Gia_ManForEachObjVec( vVisit, p, pObj, i )
        Sat_ObjSetXValue( pObj, 0 );
}